

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::errors<char[25],char[48]>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*args) [25],char (*args_1) [48]
          )

{
  long *plVar1;
  long *plVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_f1;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"constraint not satisfied","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x125f30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_c0 = *plVar2;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_4_ = (undefined4)plVar1[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_90._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"type_<const.*int.*&>::has_disallowed_qualifiers","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x125f30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_e0 = *plVar2;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar2;
    local_f0 = (long *)*plVar1;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar1 = local_60;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_60[0] = *plVar5;
    local_60[1] = plVar2[3];
    local_70 = plVar1;
  }
  else {
    local_60[0] = *plVar5;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __l._M_len = 2;
  __l._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_f1);
  lVar6 = -0x40;
  pvVar3 = extraout_RAX;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
      pvVar3 = extraout_RAX_00;
    }
    plVar1 = plVar1 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
    pvVar3 = extraout_RAX_01;
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
    pvVar3 = extraout_RAX_02;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
    pvVar3 = extraout_RAX_03;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    pvVar3 = extraout_RAX_04;
  }
  return pvVar3;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}